

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cilk_fiber.cpp
# Opt level: O2

int __thiscall cilk_fiber::remove_reference_from_thread(cilk_fiber *this)

{
  cilk_fiber_sysdep *self;
  
  cilk_fiber_sysdep::~cilk_fiber_sysdep((cilk_fiber_sysdep *)this);
  __cilkrts_free(this);
  return 0;
}

Assistant:

int cilk_fiber::remove_reference_from_thread()
{
    int ref_count = dec_ref_count();
    if (ref_count == 0) {
        cilk_fiber_sysdep* self = this->sysdep();
        self->~cilk_fiber_sysdep();
        __cilkrts_free(self);
    }
    return ref_count;
}